

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::autoRescalePartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,short *scaleFactors)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar1;
  int i_1;
  int offset_1;
  int l_1;
  int expMax;
  int i;
  int offset;
  int l;
  int patternOffset;
  float max;
  int k;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  float local_20;
  int local_1c;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x14); local_1c = local_1c + 1) {
    local_20 = 0.0;
    local_24 = local_1c * *(int *)(in_RDI + 0x2c);
    for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x34); local_28 = local_28 + 1) {
      local_2c = local_28 * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + local_24;
      for (local_30 = 0; local_30 < *(int *)(in_RDI + 0x24); local_30 = local_30 + 1) {
        if (local_20 < *(float *)(local_10 + (long)local_2c * 4)) {
          local_20 = *(float *)(local_10 + (long)local_2c * 4);
        }
        local_2c = local_2c + 1;
      }
    }
    frexp((double)local_20,&local_34);
    *(short *)(local_18 + (long)local_1c * 2) = (short)local_34;
    if (local_34 != 0) {
      for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x34); local_38 = local_38 + 1) {
        local_3c = local_38 * *(int *)(in_RDI + 0x18) * *(int *)(in_RDI + 0x2c) + local_24;
        for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x24); local_40 = local_40 + 1) {
          dVar1 = pow(2.0,(double)-local_34);
          *(float *)(local_10 + (long)local_3c * 4) =
               (float)((double)*(float *)(local_10 + (long)local_3c * 4) * dVar1);
          local_3c = local_3c + 1;
        }
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoRescalePartials(REALTYPE* destP,
                                              signed short* scaleFactors) {


    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        int expMax;
        frexp(max, &expMax);
        scaleFactors[k] = expMax;

        if (expMax != 0) {
            for (int l = 0; l < kCategoryCount; l++) {
                int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
                for (int i = 0; i < kStateCount; i++)
                    destP[offset++] *= pow(2.0, -expMax);
            }
        }
    }
}